

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmString.cxx
# Opt level: O1

String * cm::IntoString<char_*>::into_string(String *__return_storage_ptr__,char *s)

{
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if (s == (char *)0x0) {
    (__return_storage_ptr__->view_)._M_len = 0;
    (__return_storage_ptr__->view_)._M_str = (char *)0x0;
    (__return_storage_ptr__->string_).
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (__return_storage_ptr__->string_).
    super___shared_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    sVar1 = strlen(s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,s,s + sVar1);
    String::String<std::__cxx11::string,void>(__return_storage_ptr__,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String IntoString<char*>::into_string(const char* s)
{
  if (!s) {
    return String();
  }
  return std::string(s);
}